

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QHashDummyValue>::emplace_helper<QHashDummyValue_const&>
          (QHash<QString,QHashDummyValue> *this,QString *key,QHashDummyValue *args)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  piter pVar6;
  long in_FS_OFFSET;
  undefined1 local_38 [32];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::findOrInsert<QString>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QString,_QHashDummyValue>_> **)this,key);
  if (local_38[0x10] == false) {
    pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
    bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f];
    pDVar3 = (key->d).d;
    (key->d).d = (Data *)0x0;
    *(Data **)pEVar2[bVar1].storage.data = pDVar3;
    pcVar4 = (key->d).ptr;
    (key->d).ptr = (char16_t *)0x0;
    *(char16_t **)(pEVar2[bVar1].storage.data + 8) = pcVar4;
    qVar5 = (key->d).size;
    (key->d).size = 0;
    *(qsizetype *)(pEVar2[bVar1].storage.data + 0x10) = qVar5;
  }
  pVar6.bucket = local_38._8_8_;
  pVar6.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (iterator)pVar6;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }